

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

void utf8_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  char **local_40;
  char *from;
  char *to;
  char *toLim_local;
  char **toP_local;
  char *fromLim_local;
  char **fromP_local;
  ENCODING *enc_local;
  
  toP_local = (char **)fromLim;
  if ((long)toLim - (long)*toP < (long)fromLim - (long)*fromP) {
    for (toP_local = (char **)(*fromP + ((long)toLim - (long)*toP));
        (*fromP < toP_local && (((ulong)*toP_local & 0xc000000000000000) == 0x8000000000000000));
        toP_local = (char **)((long)toP_local + -1)) {
    }
  }
  from = *toP;
  for (local_40 = (char **)*fromP; local_40 != toP_local; local_40 = (char **)((long)local_40 + 1))
  {
    *from = *(char *)local_40;
    from = from + 1;
  }
  *fromP = (char *)local_40;
  *toP = from;
  return;
}

Assistant:

static
void utf8_toUtf8(const ENCODING *enc,
                 const char **fromP, const char *fromLim,
                 char **toP, const char *toLim)
{
  char *to;
  const char *from;
  cmExpatUnused(enc);
  if (fromLim - *fromP > toLim - *toP) {
    /* Avoid copying partial characters. */
    for (fromLim = *fromP + (toLim - *toP); fromLim > *fromP; fromLim--)
      if (((unsigned char)fromLim[-1] & 0xc0) != 0x80)
        break;
  }
  for (to = *toP, from = *fromP; from != fromLim; from++, to++)
    *to = *from;
  *fromP = from;
  *toP = to;
}